

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O1

CK_VOID_PTR __thiscall HandleManager::getObject(HandleManager *this,CK_OBJECT_HANDLE hObject)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  CK_VOID_PTR pvVar4;
  MutexLocker lock;
  MutexLocker local_20;
  
  MutexLocker::MutexLocker(&local_20,this->handlesMutex);
  p_Var3 = &(this->handles)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &p_Var3->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < hObject]) {
    if (*(ulong *)(p_Var2 + 1) >= hObject) {
      p_Var1 = p_Var2;
    }
  }
  p_Var2 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var1 != p_Var3) && (p_Var2 = p_Var1, hObject < *(ulong *)(p_Var1 + 1)))
  {
    p_Var2 = &p_Var3->_M_header;
  }
  if (((_Rb_tree_header *)p_Var2 == p_Var3) || (p_Var2[1]._M_parent != (_Base_ptr)0x2)) {
    pvVar4 = (CK_VOID_PTR)0x0;
  }
  else {
    pvVar4 = *(CK_VOID_PTR *)(p_Var2 + 2);
  }
  MutexLocker::~MutexLocker(&local_20);
  return pvVar4;
}

Assistant:

CK_VOID_PTR HandleManager::getObject(const CK_OBJECT_HANDLE hObject)
{
	MutexLocker lock(handlesMutex);

	std::map< CK_ULONG, Handle>::iterator it = handles.find(hObject);
	if (it == handles.end() || CKH_OBJECT != it->second.kind )
		return NULL_PTR;
	return it->second.object;
}